

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryData.cpp
# Opt level: O0

void __thiscall
amrex::BndryData::BndryData
          (BndryData *this,BoxArray *_grids,DistributionMapping *_dmap,int _ncomp,Geometry *_geom)

{
  undefined4 in_ECX;
  undefined8 *in_RDI;
  void *in_R8;
  Geometry *in_stack_00000090;
  int in_stack_0000009c;
  DistributionMapping *in_stack_000000a0;
  BoxArray *in_stack_000000a8;
  BndryData *in_stack_000000b0;
  LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  BndryRegister *in_stack_ffffffffffffffc0;
  
  BndryRegister::BndryRegister(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__BndryData_01aa6c28;
  LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
  ::LayoutData(in_stack_ffffffffffffffb0);
  LayoutData<std::array<double,_6UL>_>::LayoutData
            ((LayoutData<std::array<double,_6UL>_> *)(in_RDI + 0x150));
  Vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>::Vector
            ((Vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_> *)0x19418fa);
  memcpy(in_RDI + 0x175,in_R8,200);
  *(undefined4 *)(in_RDI + 0x18e) = in_ECX;
  *(undefined1 *)((long)in_RDI + 0xc74) = 0;
  define(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_0000009c,in_stack_00000090);
  return;
}

Assistant:

BndryData::BndryData (const BoxArray& _grids,
                      const DistributionMapping& _dmap,
                      int             _ncomp,
                      const Geometry& _geom)
    :
    geom(_geom),
    m_ncomp(_ncomp),
    m_defined(false)
{
    define(_grids,_dmap,_ncomp,_geom);
}